

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void * VmaMalloc(VkAllocationCallbacks *pAllocationCallbacks,size_t size,size_t alignment)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  void *result;
  size_t in_stack_ffffffffffffffd8;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RDI[1] == 0)) {
    pvVar1 = vma_aligned_alloc(0,in_stack_ffffffffffffffd8);
  }
  else {
    pvVar1 = (void *)(*(code *)in_RDI[1])(*in_RDI,in_RSI,in_RDX,1);
  }
  return pvVar1;
}

Assistant:

static void* VmaMalloc(const VkAllocationCallbacks* pAllocationCallbacks, size_t size, size_t alignment)
{
    void* result = VMA_NULL;
    if ((pAllocationCallbacks != VMA_NULL) &&
        (pAllocationCallbacks->pfnAllocation != VMA_NULL))
    {
        result = (*pAllocationCallbacks->pfnAllocation)(
            pAllocationCallbacks->pUserData,
            size,
            alignment,
            VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);
    }
    else
    {
        result = VMA_SYSTEM_ALIGNED_MALLOC(size, alignment);
    }
    VMA_ASSERT(result != VMA_NULL && "CPU memory allocation failed.");
    return result;
}